

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::DefaultSampling<tcu::Matrix<float,_2,_3>_>::genFixeds
          (DefaultSampling<tcu::Matrix<float,_2,_3>_> *this,FloatFormat *fmt,
          vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_> *dst)

{
  size_t scalarNdx;
  ulong uVar1;
  long lVar2;
  vector<float,_std::allocator<float>_> scalars;
  _Vector_base<float,_std::allocator<float>_> local_58;
  Matrix<float,_2,_3> local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DefaultSampling<float>::genFixeds
            ((DefaultSampling<float> *)this,fmt,(vector<float,_std::allocator<float>_> *)&local_58);
  lVar2 = 0;
  for (uVar1 = 0;
      uVar1 < (ulong)((long)local_58._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_58._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar1 = uVar1 + 1) {
    tcu::Matrix<float,_2,_3>::Matrix
              (&local_38,(float *)((long)local_58._M_impl.super__Vector_impl_data._M_start + lVar2))
    ;
    std::vector<tcu::Matrix<float,2,3>,std::allocator<tcu::Matrix<float,2,3>>>::
    emplace_back<tcu::Matrix<float,2,3>>
              ((vector<tcu::Matrix<float,2,3>,std::allocator<tcu::Matrix<float,2,3>>> *)dst,
               &local_38);
    lVar2 = lVar2 + 4;
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));

		if (Columns == Rows)
		{
			Value	mat	(0.0);
			T		x	= T(1.0f);
			mat[0][0] = x;
			for (int ndx = 0; ndx < Columns; ++ndx)
			{
				mat[Columns-1-ndx][ndx] = x;
				x *= T(2.0f);
			}
			dst.push_back(mat);
		}
	}